

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_h_predictor_16x32_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint8_t *in_stack_00000028;
  
  h_predictor_16xh(in_stack_00000028,(ptrdiff_t)dst,(uint8_t *)stride,above._4_4_);
  return;
}

Assistant:

void aom_h_predictor_16x32_sse2(uint8_t *dst, ptrdiff_t stride,
                                const uint8_t *above, const uint8_t *left) {
  (void)above;
  h_predictor_16xh(dst, stride, left, 2);
}